

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

ssize_t zip_entry_noallocread(zip_t *zip,void *buf,size_t bufsize)

{
  mz_uint file_index;
  mz_bool mVar1;
  mz_uint64 mVar2;
  
  mVar2 = 0xffffffffffffffff;
  if (((zip != (zip_t *)0x0) && ((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING)) &&
     (file_index = (zip->entry).index, -1 < (int)file_index)) {
    mVar1 = mz_zip_reader_extract_to_mem_no_alloc
                      (&zip->archive,file_index,buf,bufsize,0,(void *)0x0,0);
    if (mVar1 != 0) {
      mVar2 = (zip->entry).uncomp_size;
    }
  }
  return mVar2;
}

Assistant:

ssize_t zip_entry_noallocread(struct zip_t *zip, void *buf, size_t bufsize) {
  mz_zip_archive *pzip = NULL;

  if (!zip) {
    // zip_t handler is not initialized
    return -1;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING || zip->entry.index < 0) {
    // the entry is not found or we do not have read access
    return -1;
  }

  if (!mz_zip_reader_extract_to_mem_no_alloc(pzip, (mz_uint)zip->entry.index,
  buf, bufsize, 0, NULL,  0)) {
    return -1;
  }

  return (ssize_t)zip->entry.uncomp_size;
}